

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::scrape_failed_alert::~scrape_failed_alert(scrape_failed_alert *this)

{
  scrape_failed_alert *this_local;
  
  ~scrape_failed_alert(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

struct TORRENT_EXPORT scrape_failed_alert final : tracker_alert
	{
		// internal
		TORRENT_UNEXPORT scrape_failed_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, protocol_version v, string_view u, error_code const& e);
		TORRENT_UNEXPORT scrape_failed_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, protocol_version v, string_view u, string_view m);

		TORRENT_DEFINE_ALERT_PRIO(scrape_failed_alert, 14, alert_priority::critical)

		static inline constexpr alert_category_t static_category = alert_category::tracker | alert_category::error;
		std::string message() const override;

		// the error itself. This may indicate that the tracker sent an error
		// message (``error::tracker_failure``), in which case it can be
		// retrieved by calling ``error_message()``.
		error_code const error;

		// if the error indicates there is an associated message, this returns
		// that message. Otherwise and empty string.
		char const* error_message() const;

	private:
		aux::allocation_slot m_msg_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// contains a message describing the error.
		TORRENT_DEPRECATED std::string msg;
#endif
	}